

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVF.cpp
# Opt level: O0

void __thiscall MT32Emu::TVF::nextPhase(TVF *this)

{
  bool bVar1;
  uint newPhase_00;
  Tables *pTVar2;
  Poly *this_00;
  int local_4c;
  int local_30;
  int local_2c;
  int targetDelta;
  int newIncrement;
  int newTarget;
  int envTimeSetting;
  int envPointIndex;
  int newPhase;
  Tables *tables;
  TVF *this_local;
  
  pTVar2 = Tables::getInstance();
  newPhase_00 = this->phase + 1;
  if (this->phase - 4 < 2) {
    this_00 = Partial::getPoly(this->partial);
    bVar1 = Poly::canSustain(this_00);
    if (bVar1) {
      startRamp(this,(Bit8u)(this->levelMult * (uint)(this->partialParam->tvf).envLevel[3] >> 8),
                '\0',newPhase_00);
    }
    else {
      this->phase = newPhase_00;
      startDecay(this);
    }
  }
  else if (newPhase_00 == 7) {
    startRamp(this,'\0','\0',7);
  }
  else {
    local_2c = (uint)(this->partialParam->tvf).envTime[(int)this->phase] - this->keyTimeSubtraction;
    targetDelta = this->levelMult * (uint)(this->partialParam->tvf).envLevel[(int)this->phase] >> 8;
    if (local_2c < 1) {
      local_2c._0_1_ = 0x7f;
      if ((uint)this->target <= (uint)targetDelta) {
        local_2c._0_1_ = 0xff;
      }
    }
    else {
      local_30 = targetDelta - (uint)this->target;
      if (local_30 == 0) {
        if (targetDelta == 0) {
          local_30 = 1;
          targetDelta = 1;
        }
        else {
          local_30 = -1;
          targetDelta = targetDelta - 1;
        }
      }
      if (local_30 < 0) {
        local_4c = -local_30;
      }
      else {
        local_4c = local_30;
      }
      local_2c = (uint)pTVar2->envLogarithmicTime[local_4c] - local_2c;
      if (local_2c < 1) {
        local_2c = 1;
      }
      if (local_30 < 0) {
        local_2c._0_1_ = (byte)local_2c | 0x80;
      }
    }
    startRamp(this,(Bit8u)targetDelta,(byte)local_2c,newPhase_00);
  }
  return;
}

Assistant:

void TVF::nextPhase() {
	const Tables *tables = &Tables::getInstance();
	int newPhase = phase + 1;

	switch (newPhase) {
	case PHASE_DONE:
		startRamp(0, 0, newPhase);
		return;
	case PHASE_SUSTAIN:
	case PHASE_RELEASE:
		// FIXME: Afaict newPhase should never be PHASE_RELEASE here. And if it were, this is an odd way to handle it.
		if (!partial->getPoly()->canSustain()) {
			phase = newPhase; // FIXME: Correct?
			startDecay(); // FIXME: This should actually start decay even if phase is already 6. Does that matter?
			return;
		}
		startRamp((levelMult * partialParam->tvf.envLevel[3]) >> 8, 0, newPhase);
		return;
	default:
		break;
	}

	int envPointIndex = phase;
	int envTimeSetting = partialParam->tvf.envTime[envPointIndex] - keyTimeSubtraction;

	int newTarget = (levelMult * partialParam->tvf.envLevel[envPointIndex]) >> 8;
	int newIncrement;
	if (envTimeSetting > 0) {
		int targetDelta = newTarget - target;
		if (targetDelta == 0) {
			if (newTarget == 0) {
				targetDelta = 1;
				newTarget = 1;
			} else {
				targetDelta = -1;
				newTarget--;
			}
		}
		newIncrement = tables->envLogarithmicTime[targetDelta < 0 ? -targetDelta : targetDelta] - envTimeSetting;
		if (newIncrement <= 0) {
			newIncrement = 1;
		}
		if (targetDelta < 0) {
			newIncrement |= 0x80;
		}
	} else {
		newIncrement = newTarget >= target ? (0x80 | 127) : 127;
	}
	startRamp(newTarget, newIncrement, newPhase);
}